

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void labelfont_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  Fl_Font FVar4;
  int v_00;
  
  if ((char *)v == "LOAD") {
    iVar3 = (current_widget->o->label_).font;
    v_00 = 0;
    if (iVar3 < 0x10) {
      v_00 = iVar3;
    }
    Fl_Choice::value(i,v_00);
    return;
  }
  pFVar1 = (i->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) {
    FVar4 = -1;
  }
  else {
    FVar4 = (int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) * -0x49249249;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar2 = false;
    this = (Fl_Widget_Type *)Fl_Type::first;
    do {
      if ((this->super_Fl_Type).selected != '\0') {
        iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
        if (iVar3 != 0) {
          (this->o->label_).font = FVar4;
          Fl_Widget_Type::redraw(this);
          bVar2 = true;
        }
      }
      this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Widget_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void labelfont_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n = current_widget->o->labelfont();
    if (n > 15) n = 0;
    i->value(n);
  } else {
    int mod = 0;
    int n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelfont(n);
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}